

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint readChunk_tIME(LodePNGInfo *info,uchar *data,size_t chunkLength)

{
  uint uVar1;
  
  uVar1 = 0x49;
  if (chunkLength == 7) {
    info->time_defined = 1;
    (info->time).year = (uint)(ushort)(*(ushort *)data << 8 | *(ushort *)data >> 8);
    (info->time).month = (uint)data[2];
    (info->time).day = (uint)data[3];
    (info->time).hour = (uint)data[4];
    (info->time).minute = (uint)data[5];
    (info->time).second = (uint)data[6];
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

static unsigned readChunk_tIME(LodePNGInfo* info, const unsigned char* data, size_t chunkLength) {
  if (chunkLength != 7) return 73; /*invalid tIME chunk size*/

  info->time_defined = 1;
  info->time.year = 256u * data[0] + data[1];
  info->time.month = data[2];
  info->time.day = data[3];
  info->time.hour = data[4];
  info->time.minute = data[5];
  info->time.second = data[6];

  return 0; /* OK */
}